

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepScanLineOutputFile.cpp
# Opt level: O3

void __thiscall Imf_3_4::DeepScanLineOutputFile::Data::Data(Data *this,int numThreads)

{
  _Rb_tree_header *p_Var1;
  pointer __src;
  size_t i;
  pointer __dest;
  size_t __n;
  undefined1 in_R10B;
  size_type __len;
  ulong uVar2;
  value_type *__val;
  V2f local_38;
  
  local_38.x = 0.0;
  local_38.y = 0.0;
  Header::Header(&this->header,0x40,0x40,1.0,&local_38,1.0,INCREASING_Y,ZIP_COMPRESSION);
  p_Var1 = &(this->frameBuffer)._map._M_t._M_impl.super__Rb_tree_header;
  (this->frameBuffer)._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->frameBuffer)._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->frameBuffer)._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header
  ;
  (this->frameBuffer)._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->frameBuffer)._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  Slice::Slice(&(this->frameBuffer)._sampleCounts,HALF,(char *)0x0,0,0,1,1,0.0,(bool)in_R10B,
               SUB81(p_Var1,0));
  (this->bytesPerLine).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->bytesPerLine).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->lineOffsets).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->bytesPerLine).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->lineOffsets).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->lineOffsets).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->slices).
  super__Vector_base<Imf_3_4::(anonymous_namespace)::OutSliceInfo_*,_std::allocator<Imf_3_4::(anonymous_namespace)::OutSliceInfo_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->slices).
  super__Vector_base<Imf_3_4::(anonymous_namespace)::OutSliceInfo_*,_std::allocator<Imf_3_4::(anonymous_namespace)::OutSliceInfo_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->slices).
  super__Vector_base<Imf_3_4::(anonymous_namespace)::OutSliceInfo_*,_std::allocator<Imf_3_4::(anonymous_namespace)::OutSliceInfo_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->lineOffsetsPosition = 0;
  (this->lineBuffers).
  super__Vector_base<Imf_3_4::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::LineBuffer_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->lineBuffers).
  super__Vector_base<Imf_3_4::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::LineBuffer_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->lineBuffers).
  super__Vector_base<Imf_3_4::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::LineBuffer_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->partNumber = -1;
  (this->lineSampleCount)._size = 0;
  (this->lineSampleCount)._data = (uint *)0x0;
  this->_streamData = (OutputStreamMutex *)0x0;
  this->_deleteStream = false;
  uVar2 = 1;
  if (1 < numThreads * 2) {
    uVar2 = (ulong)(uint)(numThreads * 2);
  }
  __dest = (pointer)operator_new(uVar2 * 8);
  *__dest = (LineBuffer *)0x0;
  if ((int)uVar2 != 1) {
    memset(__dest + 1,0,uVar2 * 8 - 8);
  }
  __src = (this->lineBuffers).
          super__Vector_base<Imf_3_4::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::LineBuffer_*>_>
          ._M_impl.super__Vector_impl_data._M_start;
  __n = (long)(this->lineBuffers).
              super__Vector_base<Imf_3_4::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::LineBuffer_*>_>
              ._M_impl.super__Vector_impl_data._M_finish - (long)__src;
  if (0 < (long)__n) {
    memmove(__dest,__src,__n);
  }
  if (__src != (pointer)0x0) {
    operator_delete(__src,(long)(this->lineBuffers).
                                super__Vector_base<Imf_3_4::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::LineBuffer_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)__src);
  }
  (this->lineBuffers).
  super__Vector_base<Imf_3_4::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::LineBuffer_*>_>
  ._M_impl.super__Vector_impl_data._M_start = __dest;
  (this->lineBuffers).
  super__Vector_base<Imf_3_4::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::LineBuffer_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = __dest + uVar2;
  (this->lineBuffers).
  super__Vector_base<Imf_3_4::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::LineBuffer_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = __dest + uVar2;
  uVar2 = 0;
  do {
    __dest[uVar2] = (LineBuffer *)0x0;
    uVar2 = uVar2 + 1;
    __dest = (this->lineBuffers).
             super__Vector_base<Imf_3_4::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::LineBuffer_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  } while (uVar2 < (ulong)((long)(this->lineBuffers).
                                 super__Vector_base<Imf_3_4::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::LineBuffer_*>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)__dest >> 3));
  return;
}

Assistant:

DeepScanLineOutputFile::Data::Data (int numThreads)
    : lineOffsetsPosition (0)
    , partNumber (-1)
    , _streamData (NULL)
    , _deleteStream (false)
{
    //
    // We need at least one lineBuffer, but if threading is used,
    // to keep n threads busy we need 2*n lineBuffers.
    //

    lineBuffers.resize (max (1, 2 * numThreads));
    for (size_t i = 0; i < lineBuffers.size (); i++)
        lineBuffers[i] = 0;
}